

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btConvexHullInternal::Face_*>::~btAlignedObjectArray
          (btAlignedObjectArray<btConvexHullInternal::Face_*> *this)

{
  clear(this);
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}